

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_materialized_cte.hpp
# Opt level: O3

void __thiscall
duckdb::LogicalMaterializedCTE::LogicalMaterializedCTE
          (LogicalMaterializedCTE *this,string *ctename_p,idx_t table_index,idx_t column_count,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *cte,unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *child)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_40;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_38;
  string local_30;
  
  local_30._M_dataplus._M_p = (ctename_p->_M_dataplus)._M_p;
  paVar1 = &ctename_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == paVar1) {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_30.field_2._8_8_ = *(undefined8 *)((long)&ctename_p->field_2 + 8);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_30._M_string_length = ctename_p->_M_string_length;
  (ctename_p->_M_dataplus)._M_p = (pointer)paVar1;
  ctename_p->_M_string_length = 0;
  (ctename_p->field_2)._M_local_buf[0] = '\0';
  local_38._M_head_impl =
       (cte->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (cte->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  local_40._M_head_impl =
       (child->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (child->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  LogicalCTE::LogicalCTE
            (&this->super_LogicalCTE,&local_30,table_index,column_count,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_38,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_40,LOGICAL_MATERIALIZED_CTE);
  if (local_40._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_40._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_40._M_head_impl = (LogicalOperator *)0x0;
  if (local_38._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_38._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_38._M_head_impl = (LogicalOperator *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  (this->super_LogicalCTE).super_LogicalOperator._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalCTE_01984110;
  return;
}

Assistant:

LogicalMaterializedCTE(string ctename_p, idx_t table_index, idx_t column_count, unique_ptr<LogicalOperator> cte,
	                       unique_ptr<LogicalOperator> child)
	    : LogicalCTE(std::move(ctename_p), table_index, column_count, std::move(cte), std::move(child),
	                 LogicalOperatorType::LOGICAL_MATERIALIZED_CTE) {
	}